

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTNode.cpp
# Opt level: O0

void __thiscall AST::ASTNode::ASTNode(ASTNode *this,string *name,Token *token)

{
  int iVar1;
  string local_50;
  Token *local_20;
  Token *token_local;
  string *name_local;
  ASTNode *this_local;
  
  this->_vptr_ASTNode = (_func_int **)&PTR_accept_001a31e0;
  local_20 = token;
  token_local = (Token *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->name);
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::deque(&this->children);
  std::__cxx11::string::string((string *)&this->type);
  std::__cxx11::string::string((string *)&this->tag);
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  if (local_20 != (Token *)0x0) {
    iVar1 = Token::getLineno(local_20);
    this->lineNumber = iVar1;
    Token::getTypeString_abi_cxx11_(&local_50,local_20);
    std::__cxx11::string::operator=((string *)&this->type,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  iVar1 = counter + 1;
  this->uniqueID = counter;
  counter = iVar1;
  return;
}

Assistant:

AST::ASTNode::ASTNode(std::string name, Token *token) {
    this->name = std::move(name);
    if (token != nullptr) {
        this->lineNumber = token->getLineno();
        this->type = token->getTypeString();
    }
    uniqueID = counter++;
}